

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SpectrumBilerpTexture::Evaluate
          (SpectrumBilerpTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  anon_class_24_3_48d30edf func;
  float fVar7;
  float fVar14;
  undefined1 auVar9 [64];
  undefined1 auVar15 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  ulong in_XMM1_Qa;
  undefined1 auVar20 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar21;
  SampledSpectrum SVar22;
  Tuple3<pbrt::Point3,_float> *local_110;
  undefined8 **ppuStack_108;
  Vector2f **local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Tuple2<pbrt::Vector2,_float> local_88;
  undefined8 local_80;
  Tuple2<pbrt::Vector2,_float> *local_78;
  undefined8 *local_70;
  Tuple3<pbrt::Point3,_float> local_68 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_50 [3];
  int iStack_2c;
  undefined1 auVar10 [64];
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  undefined1 auVar16 [64];
  
  local_70 = &local_80;
  local_80 = 0;
  local_78 = &local_88;
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_110 = local_68;
  local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[2].z = ctx.dvdy;
  iStack_2c = ctx.faceIndex;
  ppuStack_108 = &local_70;
  local_100 = (Vector2f **)&local_78;
  auVar20 = ZEXT856(in_XMM1_Qa);
  func.dstdx = (Vector2f **)ppuStack_108;
  func.ctx = (TextureEvalContext *)local_110;
  func.dstdy = local_100;
  auVar9._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar9._8_56_ = extraout_var;
  local_98 = auVar9._0_16_;
  local_68[0]._0_8_ =
       (this->v00).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  auVar15 = extraout_var;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_110,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar16._0_8_ = SVar22.values.values._8_8_;
  auVar16._8_56_ = auVar20;
  auVar10._0_8_ = SVar22.values.values._0_8_;
  auVar10._8_56_ = auVar15;
  local_a8 = auVar10._0_16_;
  local_b8 = auVar16._0_16_;
  local_68[0]._0_8_ =
       (this->v10).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_110,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar17._0_8_ = SVar22.values.values._8_8_;
  auVar17._8_56_ = auVar20;
  auVar11._0_8_ = SVar22.values.values._0_8_;
  auVar11._8_56_ = auVar15;
  local_c8 = auVar11._0_16_;
  local_d8 = auVar17._0_16_;
  local_68[0]._0_8_ =
       (this->v01).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_110,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar18._0_8_ = SVar22.values.values._8_8_;
  auVar18._8_56_ = auVar20;
  auVar12._0_8_ = SVar22.values.values._0_8_;
  auVar12._8_56_ = auVar15;
  local_e8 = auVar12._0_16_;
  local_f8 = auVar18._0_16_;
  local_68[0]._0_8_ =
       (this->v11).
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  SVar22 = DispatchSplit<7>::operator()
                     ((DispatchSplit<7> *)&local_110,&lambda,local_68,
                      (ulong)local_68[0]._0_8_ >> 0x30);
  auVar19._0_8_ = SVar22.values.values._8_8_;
  auVar19._8_56_ = auVar20;
  auVar13._0_8_ = SVar22.values.values._0_8_;
  auVar13._8_56_ = auVar15;
  fVar21 = local_98._0_4_;
  auVar8 = vmovshdup_avx(local_98);
  fVar7 = auVar8._0_4_;
  auVar4 = vunpcklpd_avx(local_a8,local_b8);
  fVar1 = (1.0 - fVar21) * (1.0 - fVar7);
  auVar5 = vunpcklpd_avx(local_c8,local_d8);
  fVar2 = fVar21 * (1.0 - fVar7);
  auVar6 = vunpcklpd_avx(local_e8,local_f8);
  fVar3 = fVar7 * (1.0 - fVar21);
  auVar8 = vmovlhps_avx(auVar13._0_16_,auVar19._0_16_);
  fVar21 = fVar21 * fVar7;
  fVar7 = fVar21 * auVar8._0_4_ + fVar3 * auVar6._0_4_ + fVar2 * auVar5._0_4_ + fVar1 * auVar4._0_4_
  ;
  fVar14 = fVar21 * auVar8._4_4_ +
           fVar3 * auVar6._4_4_ + fVar2 * auVar5._4_4_ + fVar1 * auVar4._4_4_;
  auVar8 = CONCAT412(fVar21 * auVar8._12_4_ +
                     fVar3 * auVar6._12_4_ + fVar2 * auVar5._12_4_ + fVar1 * auVar4._12_4_,
                     CONCAT48(fVar21 * auVar8._8_4_ +
                              fVar3 * auVar6._8_4_ + fVar2 * auVar5._8_4_ + fVar1 * auVar4._8_4_,
                              CONCAT44(fVar14,fVar7)));
  auVar8 = vshufpd_avx(auVar8,auVar8,1);
  SVar22.values.values._8_8_ = auVar8._0_8_;
  SVar22.values.values[0] = fVar7;
  SVar22.values.values[1] = fVar14;
  return (SampledSpectrum)SVar22.values.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Bilerp({st[0], st[1]}, {v00.Sample(lambda), v10.Sample(lambda),
                                       v01.Sample(lambda), v11.Sample(lambda)});
    }